

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

float * __thiscall google::protobuf::RepeatedField<float>::Get(RepeatedField<float> *this,int index)

{
  float *pfVar1;
  int in_ESI;
  RepeatedField<float> *in_stack_ffffffffffffffa0;
  
  pfVar1 = elements(in_stack_ffffffffffffffa0);
  return pfVar1 + in_ESI;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return elements()[index];
}